

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  ALLEGRO_DISPLAY *display;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  char *format;
  undefined1 auVar5 [16];
  Theme theme;
  Prog prog;
  Theme TStack_1368;
  Prog local_1330;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') goto LAB_00108e4a;
  al_install_keyboard();
  al_install_mouse();
  al_init_primitives_addon();
  al_init_font_addon();
  al_init_ttf_addon();
  al_set_new_display_flags(0x40);
  display = (ALLEGRO_DISPLAY *)al_create_display(800,600);
  if (display == (ALLEGRO_DISPLAY *)0x0) {
    format = "Unable to create display\n";
  }
  else {
    al_set_window_title(display,"Synthesiser of sorts");
    font_gui = (ALLEGRO_FONT *)al_load_ttf_font("data/DejaVuSans.ttf",0xc,0);
    if (font_gui == (ALLEGRO_FONT *)0x0) {
      format = "Failed to load font\n";
    }
    else {
      cVar1 = al_install_audio();
      if (cVar1 == '\0') {
        format = "Could not init sound!\n";
      }
      else {
        cVar1 = al_reserve_samples(0);
        if (cVar1 == '\0') {
          format = "Could not set up voice and mixer.\n";
        }
        else {
          stream1 = (ALLEGRO_AUDIO_STREAM *)al_create_audio_stream(8,0x400,0xac44,3,0x10);
          stream2 = (ALLEGRO_AUDIO_STREAM *)al_create_audio_stream(8,0x400,0xac44,3,0x10);
          stream3 = (ALLEGRO_AUDIO_STREAM *)al_create_audio_stream(8,0x400,0xac44,3,0x10);
          stream4 = (ALLEGRO_AUDIO_STREAM *)al_create_audio_stream(8,0x400,0xac44,3,0x10);
          uVar3 = 3;
          stream5 = (ALLEGRO_AUDIO_STREAM *)al_create_audio_stream(8,0x400,0xac44,3,0x10);
          auVar5._0_4_ = -(uint)((int)((ulong)stream1 >> 0x20) == 0 && (int)stream1 == 0);
          auVar5._4_4_ = -(uint)((int)stream2 == 0 && (int)((ulong)stream2 >> 0x20) == 0);
          auVar5._8_4_ = -(uint)((int)((ulong)stream3 >> 0x20) == 0 && (int)stream3 == 0);
          auVar5._12_4_ = -(uint)((int)stream4 == 0 && (int)((ulong)stream4 >> 0x20) == 0);
          iVar4 = movmskps(uVar3,auVar5);
          if ((iVar4 == 0) && (stream5 != (ALLEGRO_AUDIO_STREAM *)0x0)) {
            uVar2 = al_get_default_mixer();
            cVar1 = al_attach_audio_stream_to_mixer(stream1,uVar2);
            if (cVar1 != '\0') {
              cVar1 = al_attach_audio_stream_to_mixer(stream2,uVar2);
              if (cVar1 != '\0') {
                cVar1 = al_attach_audio_stream_to_mixer(stream3,uVar2);
                if (cVar1 != '\0') {
                  cVar1 = al_attach_audio_stream_to_mixer(stream4,uVar2);
                  if (cVar1 != '\0') {
                    cVar1 = al_attach_audio_stream_to_mixer(stream5,uVar2);
                    if (cVar1 != '\0') {
                      al_set_mixer_postprocess_callback(uVar2,mixer_pp_callback,uVar2);
                      Theme::Theme(&TStack_1368,font_gui);
                      Prog::Prog(&local_1330,&TStack_1368,display);
                      Prog::run(&local_1330);
                      Prog::~Prog(&local_1330);
                      al_destroy_audio_stream(stream1);
                      al_destroy_audio_stream(stream2);
                      al_destroy_audio_stream(stream3);
                      al_destroy_audio_stream(stream4);
                      al_destroy_audio_stream(stream5);
                      al_uninstall_audio();
                      al_destroy_font(font_gui);
                      al_fclose(save_fp);
                      return 0;
                    }
                  }
                }
              }
            }
            format = "Could not attach stream to mixer.\n";
          }
          else {
            format = "Could not create stream.\n";
          }
        }
      }
    }
  }
  do {
    abort_example(format);
LAB_00108e4a:
    format = "Could not init Allegro.\n";
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
   ALLEGRO_DISPLAY *display;
   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   al_install_keyboard();
   al_install_mouse();

   al_init_primitives_addon();
   al_init_font_addon();
   al_init_ttf_addon();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Unable to create display\n");
   }
   al_set_window_title(display, "Synthesiser of sorts");

   font_gui = al_load_ttf_font("data/DejaVuSans.ttf", 12, 0);
   if (!font_gui) {
      abort_example("Failed to load font\n");
   }

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   if (!al_reserve_samples(0)) {
      abort_example("Could not set up voice and mixer.\n");
   }

   size_t buffers = 8;
   unsigned samples = SAMPLES_PER_BUFFER;
   unsigned freq = STREAM_FREQUENCY;
   ALLEGRO_AUDIO_DEPTH depth = ALLEGRO_AUDIO_DEPTH_FLOAT32;
   ALLEGRO_CHANNEL_CONF ch = ALLEGRO_CHANNEL_CONF_1;

   stream1 = al_create_audio_stream(buffers, samples, freq, depth, ch);
   stream2 = al_create_audio_stream(buffers, samples, freq, depth, ch);
   stream3 = al_create_audio_stream(buffers, samples, freq, depth, ch);
   stream4 = al_create_audio_stream(buffers, samples, freq, depth, ch);
   stream5 = al_create_audio_stream(buffers, samples, freq, depth, ch);
   if (!stream1 || !stream2 || !stream3 || !stream4 || !stream5) {
      abort_example("Could not create stream.\n");
   }

   ALLEGRO_MIXER *mixer = al_get_default_mixer();
   if (
      !al_attach_audio_stream_to_mixer(stream1, mixer) ||
      !al_attach_audio_stream_to_mixer(stream2, mixer) ||
      !al_attach_audio_stream_to_mixer(stream3, mixer) ||
      !al_attach_audio_stream_to_mixer(stream4, mixer) ||
      !al_attach_audio_stream_to_mixer(stream5, mixer)
   ) {
      abort_example("Could not attach stream to mixer.\n");
   }

   al_set_mixer_postprocess_callback(mixer, mixer_pp_callback, mixer);

   /* Prog is destroyed at the end of this scope. */
   {
      Theme theme(font_gui);
      Prog prog(theme, display);
      prog.run();
   }

   al_destroy_audio_stream(stream1);
   al_destroy_audio_stream(stream2);
   al_destroy_audio_stream(stream3);
   al_destroy_audio_stream(stream4);
   al_destroy_audio_stream(stream5);
   al_uninstall_audio();

   al_destroy_font(font_gui);

   al_fclose(save_fp);

   close_log(false);

   return 0;
}